

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall RoleMaskProxyModel::clearMaskedData(RoleMaskProxyModel *this,QModelIndex *index)

{
  RoleMaskProxyModelPrivate *this_00;
  bool bVar1;
  FlaggedRolesContainer *this_01;
  QVector<int> changedRoles;
  QList<int> changedRolesList;
  QModelIndex sourceIndex;
  QArrayDataPointer<int> local_68;
  QArrayDataPointer<int> local_50;
  QModelIndex local_38;
  
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    this_00 = this->d_ptr;
    (**(code **)(*(long *)this + 400))(&local_38,this,index);
    this_01 = RoleMaskProxyModelPrivate::dataForIndex(this_00,&local_38);
    if (this_01 != (FlaggedRolesContainer *)0x0) {
      QMap<int,_QVariant>::keys((QList<int> *)&local_50,&this_01->roles);
      local_68.d = local_50.d;
      local_68.ptr = local_50.ptr;
      local_68.size = local_50.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RoleMaskProxyModelPrivate::removeIndex(this_00,&local_38);
      maskedDataChanged(this,index,index,(QVector<int> *)&local_68);
      QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_50);
    }
  }
  return;
}

Assistant:

void RoleMaskProxyModel::clearMaskedData(const QModelIndex &index)
{
    if (!index.isValid())
        return;
    Q_ASSERT(index.model() == this);
    Q_D(RoleMaskProxyModel);
    const QModelIndex sourceIndex = mapToSource(index);
    const FlaggedRolesContainer *maskedIter = d->dataForIndex(sourceIndex);
    if (!maskedIter)
        return;
    Q_ASSERT(!maskedIter->roles.isEmpty());
    const QList<int> changedRolesList = maskedIter->roles.keys();
    const QVector<int> changedRoles = changedRolesList.toVector();
    Q_ASSUME(d->removeIndex(sourceIndex));
    maskedDataChanged(index, index, changedRoles);
    dataChanged(index, index, changedRoles);
}